

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::createDebugGlobalVariable(Builder *this,Id type,char *name,Id variable)

{
  Id IVar1;
  Instruction *this_00;
  Id IVar2;
  allocator<char> local_51;
  string local_50;
  
  if (type != 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    IVar2 = this->uniqueId + 1;
    this->uniqueId = IVar2;
    IVar1 = makeVoidType(this);
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
    this_00->resultId = IVar2;
    this_00->typeId = IVar1;
    this_00->opCode = OpExtInst;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    this_00->block = (Block *)0x0;
    Instruction::reserveOperands(this_00,0xb);
    Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(this_00,0x12);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
    IVar1 = getStringId(this,&local_50);
    Instruction::addIdOperand(this_00,IVar1);
    std::__cxx11::string::_M_dispose();
    Instruction::addIdOperand(this_00,type);
    IVar1 = makeDebugSource(this,this->currentFileId);
    Instruction::addIdOperand(this_00,IVar1);
    IVar1 = makeUintConstant(this,this->currentLine,false);
    Instruction::addIdOperand(this_00,IVar1);
    IVar1 = makeUintConstant(this,0,false);
    Instruction::addIdOperand(this_00,IVar1);
    IVar1 = makeDebugCompilationUnit(this);
    Instruction::addIdOperand(this_00,IVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
    IVar1 = getStringId(this,&local_50);
    Instruction::addIdOperand(this_00,IVar1);
    std::__cxx11::string::_M_dispose();
    Instruction::addIdOperand(this_00,variable);
    IVar1 = makeUintConstant(this,8,false);
    Instruction::addIdOperand(this_00,IVar1);
    local_50._M_dataplus._M_p = (pointer)this_00;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
    if ((Instruction *)local_50._M_dataplus._M_p != (Instruction *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
    Module::mapInstruction(&this->module,this_00);
    return this_00->resultId;
  }
  __assert_fail("type != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x4b0,
                "Id spv::Builder::createDebugGlobalVariable(const Id, const char *const, const Id)")
  ;
}

Assistant:

Id Builder::createDebugGlobalVariable(Id const type, char const*const name, Id const variable)
{
    assert(type != 0);

    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(11);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugGlobalVariable);
    inst->addIdOperand(getStringId(name)); // name id
    inst->addIdOperand(type); // type id
    inst->addIdOperand(makeDebugSource(currentFileId)); // source id
    inst->addIdOperand(makeUintConstant(currentLine)); // line id TODO: currentLine always zero?
    inst->addIdOperand(makeUintConstant(0)); // TODO: column id
    inst->addIdOperand(makeDebugCompilationUnit()); // scope id
    inst->addIdOperand(getStringId(name)); // linkage name id
    inst->addIdOperand(variable); // variable id
    inst->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsDefinition)); // flags id

    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
    module.mapInstruction(inst);

    return inst->getResultId();
}